

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall
Memory::HeapBlockMap64::SetHeapBlockNoCheck
          (HeapBlockMap64 *this,void *address,size_t pageCount,HeapBlock *heapBlock,
          HeapBlockType blockType,byte bucketIndex)

{
  anon_class_24_3_1c12e959 fn;
  byte local_2a;
  HeapBlockType local_29;
  byte bucketIndex_local;
  HeapBlock *pHStack_28;
  HeapBlockType blockType_local;
  HeapBlock *heapBlock_local;
  size_t pageCount_local;
  void *address_local;
  HeapBlockMap64 *this_local;
  
  fn.blockType = &local_29;
  fn.heapBlock = &stack0xffffffffffffffd8;
  fn.bucketIndex = &local_2a;
  local_2a = bucketIndex;
  local_29 = blockType;
  pHStack_28 = heapBlock;
  heapBlock_local = (HeapBlock *)pageCount;
  pageCount_local = (size_t)address;
  address_local = this;
  ForEachNodeInAddressRange<Memory::HeapBlockMap64::SetHeapBlockNoCheck(void*,unsigned_long,Memory::HeapBlock*,Memory::HeapBlock::HeapBlockType,unsigned_char)::__0>
            (this,address,pageCount,fn);
  return;
}

Assistant:

void
HeapBlockMap64::SetHeapBlockNoCheck(void * address, size_t pageCount, HeapBlock * heapBlock, HeapBlock::HeapBlockType blockType, byte bucketIndex)
{
    ForEachNodeInAddressRange(address, pageCount, [&](Node * node, void * address, uint nodePages)
    {
        Assert(node != nullptr);
        node->map.SetHeapBlockNoCheck(address, nodePages, heapBlock, blockType, bucketIndex);
    });
}